

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_context.cpp
# Opt level: O3

vector<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::allocator<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>_>
* __thiscall
jessilib::io::command_context::paramaters
          (vector<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::allocator<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>_>
           *__return_storage_ptr__,command_context *this)

{
  pointer *ppbVar1;
  size_type sVar2;
  pointer pcVar3;
  iterator __position;
  size_type sVar4;
  void *pvVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  size_type __n;
  ulong uVar9;
  char8_t *__s;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::allocator<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::allocator<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::allocator<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sVar2 = (this->m_parameter)._M_string_length;
  if (sVar2 != 0) {
    pcVar3 = (this->m_parameter)._M_dataplus._M_p;
    sVar4 = 0;
    do {
      if (pcVar3[sVar4] != ' ') {
        if (sVar4 == 0xffffffffffffffff) {
          return __return_storage_ptr__;
        }
        uVar9 = sVar2 - sVar4;
        if (uVar9 == 0) {
          return __return_storage_ptr__;
        }
        __s = pcVar3 + sVar4;
        do {
          pvVar5 = memchr(__s,0x20,uVar9);
          uVar8 = (long)pvVar5 - (long)__s;
          if ((long)pvVar5 - (long)__s == 0xffffffffffffffff) {
            uVar8 = uVar9;
          }
          if (pvVar5 == (void *)0x0) {
            uVar8 = uVar9;
          }
          local_38._M_len = uVar8;
          if (uVar9 < uVar8) {
            local_38._M_len = uVar9;
          }
          __position._M_current =
               (__return_storage_ptr__->
               super__Vector_base<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::allocator<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          local_38._M_str = __s;
          if (__position._M_current ==
              (__return_storage_ptr__->
              super__Vector_base<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::allocator<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<std::basic_string_view<char8_t,std::char_traits<char8_t>>,std::allocator<std::basic_string_view<char8_t,std::char_traits<char8_t>>>>
            ::_M_realloc_insert<std::basic_string_view<char8_t,std::char_traits<char8_t>>>
                      ((vector<std::basic_string_view<char8_t,std::char_traits<char8_t>>,std::allocator<std::basic_string_view<char8_t,std::char_traits<char8_t>>>>
                        *)__return_storage_ptr__,__position,&local_38);
          }
          else {
            (__position._M_current)->_M_len = local_38._M_len;
            (__position._M_current)->_M_str = __s;
            ppbVar1 = &(__return_storage_ptr__->
                       super__Vector_base<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::allocator<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            *ppbVar1 = *ppbVar1 + 1;
          }
          uVar9 = uVar9 - uVar8;
          uVar6 = 0xffffffffffffffff;
          if (uVar9 != 0) {
            uVar7 = 0;
            do {
              uVar6 = uVar7;
              if (__s[uVar7 + uVar8] != ' ') break;
              uVar7 = uVar7 + 1;
              uVar6 = 0xffffffffffffffff;
            } while (uVar9 != uVar7);
          }
          if (uVar9 < uVar6) {
            uVar6 = uVar9;
          }
          __s = __s + uVar6 + uVar8;
          uVar9 = uVar9 - uVar6;
          if (uVar9 == 0) {
            return __return_storage_ptr__;
          }
        } while( true );
      }
      sVar4 = sVar4 + 1;
    } while (sVar2 != sVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::u8string_view> command_context::paramaters() const {
	std::vector<std::u8string_view> result;
	std::u8string_view parameter = m_parameter;

	// Strip leading whitespace
	std::size_t pos = parameter.find_first_not_of(' ');
	if (pos == std::string_view::npos) {
		// parameter is empty; return empty vector
		return result;
	}
	parameter.remove_prefix(pos);

	// Parse parameter into result
	while (!parameter.empty()) {
		// Parse word from parameter into result
		pos = parameter.find(' ');
		if (pos == std::string_view::npos) {
			pos = parameter.size();
		}
		result.push_back(parameter.substr(0, pos));

		// Strip word and trailing whitespace
		parameter.remove_prefix(pos);
		parameter.remove_prefix(std::min(parameter.find_first_not_of(' '), parameter.size()));
	}

	return result;
}